

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_image_ccitt.c
# Opt level: O2

HPDF_STATUS
HPDF_Stream_CcittToStream
          (HPDF_BYTE *buf,HPDF_Stream dst,HPDF_Encrypt e,HPDF_UINT width,HPDF_UINT height,
          HPDF_UINT line_width,HPDF_BOOL top_is_first)

{
  uint bs;
  uint uVar1;
  int iVar2;
  int32 iVar3;
  int32 iVar4;
  HPDF_Fax3CodecState *pHVar5;
  uint32 *puVar6;
  uchar *puVar7;
  HPDF_UINT HVar8;
  tableentry *tab;
  uint bs_00;
  ulong uVar9;
  uint32 rowpixels;
  HPDF_Fax3CodecState *esp;
  ulong uVar10;
  uint uVar11;
  int bs_01;
  HPDF_STATUS HVar12;
  uchar *local_90;
  HPDF_BYTE *local_78;
  _HPDF_CCITT_Data local_68;
  long local_40;
  HPDF_Fax3CodecState *local_38;
  
  HVar12 = 1;
  if (height != 0) {
    if (top_is_first == 0) {
      local_78 = buf + (height - 1) * line_width;
      uVar9 = -(ulong)line_width;
      HVar8 = -line_width;
    }
    else {
      uVar9 = (ulong)(height * line_width);
      HVar8 = line_width;
      local_78 = buf;
    }
    local_68.dst = dst;
    local_68.tif_rawcp = (tidata_t)malloc(0x4000);
    local_68.tif_rawdatasize = 0x4000;
    local_68.tif_rawcc = 0;
    local_68.tif_rawdata = local_68.tif_rawcp;
    pHVar5 = (HPDF_Fax3CodecState *)malloc(0x80);
    if (pHVar5 != (HPDF_Fax3CodecState *)0x0) {
      (pHVar5->b).faxdcs = (char *)0x0;
      pHVar5->refline = (uchar *)0x0;
      (pHVar5->b).groupoptions = 0;
      (pHVar5->b).recvparams = 0;
      (pHVar5->b).subaddress = (char *)0x0;
      (pHVar5->b).rowbytes = line_width;
      (pHVar5->b).rowpixels = width;
      uVar11 = width * 2 + 0x3e & 0xffffffc0;
      local_68.tif_data = pHVar5;
      puVar6 = (uint32 *)malloc((ulong)(uVar11 * 2 + 6) << 2);
      pHVar5->runs = puVar6;
      if (puVar6 == (uint32 *)0x0) {
        HVar12 = 1;
      }
      else {
        pHVar5->curruns = puVar6;
        pHVar5->refruns = puVar6 + (uVar11 | 3);
        HVar12 = 1;
        puVar7 = (uchar *)calloc(1,(ulong)line_width);
        pHVar5->refline = puVar7;
        if (puVar7 != (uchar *)0x0) {
          pHVar5->data = 0;
          pHVar5->bit = 8;
          pHVar5->k = 0;
          pHVar5->maxk = 0;
          pHVar5->line = 0;
          local_40 = (long)(int)HVar8;
          for (; buf + uVar9 != local_78; local_78 = local_78 + local_40) {
            local_38 = local_68.tif_data;
            pHVar5 = local_68.tif_data;
            local_90 = local_78;
            for (HVar8 = line_width; 0 < (int)HVar8; HVar8 = HVar8 - uVar11) {
              puVar7 = pHVar5->refline;
              uVar11 = (pHVar5->b).rowpixels;
              uVar1 = 0;
              bs = 0;
              if (-1 < (char)*local_90) {
                bs = find0span(local_90,0,uVar11);
              }
              if (-1 < (char)*puVar7) {
                uVar1 = find0span(puVar7,0,uVar11);
              }
              uVar10 = 0;
              while( true ) {
                bs_00 = uVar11;
                if (uVar1 < uVar11) {
                  if ((puVar7[uVar1 >> 3] >> (~(byte)uVar1 & 7) & 1) == 0) {
                    iVar2 = find0span(puVar7,uVar1,uVar11);
                  }
                  else {
                    iVar2 = find1span(puVar7,uVar1,uVar11);
                  }
                  bs_00 = iVar2 + uVar1;
                }
                if (bs_00 < bs) {
                  HPDF_Fax3PutBits(&local_68,1,4);
                }
                else {
                  uVar1 = (uVar1 - bs) + 3;
                  if (uVar1 < 7) {
                    HPDF_Fax3PutBits(&local_68,(uint)vcodes[uVar1].code,(uint)vcodes[uVar1].length);
                    bs_00 = bs;
                  }
                  else {
                    bs_00 = uVar11;
                    if (bs < uVar11) {
                      if ((local_90[bs >> 3] >> (~(byte)bs & 7) & 1) == 0) {
                        iVar2 = find0span(local_90,bs,uVar11);
                      }
                      else {
                        iVar2 = find1span(local_90,bs,uVar11);
                      }
                      bs_00 = iVar2 + bs;
                    }
                    HPDF_Fax3PutBits(&local_68,1,3);
                    iVar2 = (int)uVar10;
                    if ((iVar2 + bs == 0) ||
                       ((local_90[uVar10 >> 3] >> (~(byte)uVar10 & 7) & 1) == 0)) {
                      putspan(&local_68,bs - iVar2,HPDF_TIFFFaxWhiteCodes);
                      tab = HPDF_TIFFFaxBlackCodes;
                    }
                    else {
                      putspan(&local_68,bs - iVar2,HPDF_TIFFFaxBlackCodes);
                      tab = HPDF_TIFFFaxWhiteCodes;
                    }
                    putspan(&local_68,bs_00 - bs,tab);
                  }
                }
                pHVar5 = local_38;
                if (uVar11 <= bs_00) break;
                if ((local_90[bs_00 >> 3] >> (~(byte)bs_00 & 7) & 1) == 0) {
                  iVar3 = find0span(local_90,bs_00,uVar11);
                  iVar4 = find1span(puVar7,bs_00,uVar11);
                  bs_01 = iVar4 + bs_00;
                  iVar2 = find0span(puVar7,bs_01,uVar11);
                }
                else {
                  iVar3 = find1span(local_90,bs_00,uVar11);
                  iVar4 = find0span(puVar7,bs_00,uVar11);
                  bs_01 = iVar4 + bs_00;
                  iVar2 = find1span(puVar7,bs_01,uVar11);
                }
                uVar1 = bs_01 + iVar2;
                bs = iVar3 + bs_00;
                uVar10 = (ulong)bs_00;
              }
              memcpy(local_38->refline,local_90,(ulong)(local_38->b).rowbytes);
              uVar11 = (pHVar5->b).rowbytes;
              local_90 = local_90 + uVar11;
            }
          }
          HPDF_Fax3PutBits(&local_68,1,0xc);
          HPDF_Fax3PutBits(&local_68,1,0xc);
          HPDF_CCITT_FlushData(&local_68);
          HVar12 = 0;
        }
      }
      HPDF_FreeCCITTFax3(&local_68);
    }
  }
  return HVar12;
}

Assistant:

HPDF_STATUS 
HPDF_Stream_CcittToStream( const HPDF_BYTE   *buf,
                            HPDF_Stream  dst,
							HPDF_Encrypt  e,
							HPDF_UINT          width,
							HPDF_UINT          height,
							HPDF_UINT          line_width,
							HPDF_BOOL		   top_is_first)
{
	const HPDF_BYTE   *pBufPos;
	const HPDF_BYTE   *pBufEnd; /* end marker */
	int lineIncrement;
	struct _HPDF_CCITT_Data data;

	HPDF_UNUSED (e);

	if(height==0) return 1;
	if(top_is_first) {
		pBufPos = buf;
		pBufEnd=buf+(line_width*height);
		lineIncrement = line_width;
	} else {
		pBufPos = buf+(line_width*(height-1));
		pBufEnd= buf-line_width;
		lineIncrement = -((int)line_width);
	}	

	memset(&data, 0, sizeof(struct _HPDF_CCITT_Data));
	data.dst = dst;
	data.tif_rawdata = (tidata_t) malloc( 16384 ); /*  16 kb buffer */
	data.tif_rawdatasize = 16384;
	data.tif_rawcc = 0;
	data.tif_rawcp = data.tif_rawdata;

	if(HPDF_InitCCITTFax3(&data)!=HPDF_OK)
		return 1;

	if(HPDF_Fax3SetupState(&data, width, height, line_width)!=HPDF_OK)
	{
		HPDF_FreeCCITTFax3(&data);
		return 1;
	}

	if(HPDF_Fax3PreEncode(&data)!=HPDF_OK)
	{
		HPDF_FreeCCITTFax3(&data);
		return 1;
	}

	/*  encode data */
	while(pBufEnd!=pBufPos)
	{
		HPDF_Fax4Encode(&data, (tidata_t)pBufPos, line_width);
		pBufPos+=lineIncrement;
	}

	HPDF_Fax4PostEncode(&data);

	HPDF_FreeCCITTFax3(&data);

	return HPDF_OK;
}